

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void __thiscall r_exec::View::View(View *this,View *view,bool new_OID)

{
  _Object *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint64_t uVar9;
  undefined3 in_register_00000011;
  
  r_code::View::View(&this->super_View);
  (this->super_View).super__Object._vptr__Object = (_func_int **)&PTR__View_001c1620;
  (this->controller).object = (_Object *)0x0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_groupMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_groupMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  core::P<r_code::Code>::operator=(&(this->super_View).object,&(view->super_View).object);
  uVar2 = *(undefined4 *)&(view->super_View).field_0x2c;
  uVar3 = *(undefined4 *)&(view->super_View).field_0x30;
  uVar4 = *(undefined4 *)&(view->super_View).field_0x34;
  uVar5 = *(undefined8 *)&(view->super_View).field_0x38;
  uVar6 = *(undefined8 *)&(view->super_View).field_0x40;
  uVar7 = *(undefined8 *)&(view->super_View).field_0x48;
  uVar8 = *(undefined8 *)&(view->super_View).field_0x50;
  *(undefined4 *)&(this->super_View).field_0x28 = *(undefined4 *)&(view->super_View).field_0x28;
  *(undefined4 *)&(this->super_View).field_0x2c = uVar2;
  *(undefined4 *)&(this->super_View).field_0x30 = uVar3;
  *(undefined4 *)&(this->super_View).field_0x34 = uVar4;
  *(undefined8 *)&(this->super_View).field_0x38 = uVar5;
  *(undefined8 *)&(this->super_View).field_0x40 = uVar6;
  *(undefined8 *)&(this->super_View).field_0x48 = uVar7;
  *(undefined8 *)&(this->super_View).field_0x50 = uVar8;
  *(undefined4 *)&(this->super_View).field_0x58 = *(undefined4 *)&(view->super_View).field_0x58;
  (this->super_View).references[0] = (view->super_View).references[0];
  (this->super_View).references[1] = (view->super_View).references[1];
  if (CONCAT31(in_register_00000011,new_OID) != 0) {
    uVar9 = GetOID();
    *(int *)&(this->super_View).field_0x58 = (int)uVar9;
  }
  p_Var1 = (this->controller).object;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var1->_vptr__Object[1])();
    }
    (this->controller).object = (_Object *)0x0;
  }
  reset(this);
  return;
}

Assistant:

View::View(const View *view, bool new_OID): r_code::View(), controller(nullptr)
{
    object = view->object;
    memcpy(_code, view->_code, VIEW_CODE_MAX_SIZE * sizeof(Atom));
    references[0] = view->references[0];
    references[1] = view->references[1];

    if (new_OID) {
        _code[VIEW_OID].atom = GetOID();
    }

    controller = nullptr; // deprecated: controller=view->controller;
    reset();
}